

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,NullType *type)

{
  ostream *poVar1;
  TlbExportVisitor local_88 [32];
  TlbExportVisitor local_68 [48];
  string local_38 [32];
  NullType *local_18;
  NullType *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = type;
  type_local = (NullType *)this;
  poVar1 = std::operator<<(this->m_stream,"<null ");
  poVar1 = std::operator<<(poVar1," name=\"");
  Typelib::Type::getName_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(local_68);
  poVar1 = std::operator<<(poVar1,(string *)local_68);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_38);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_88,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_88);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_88);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</null>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (NullType const& type)
    {
        m_stream << "<null " << " name=\"" << type.getName() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</null>";
        return true;
    }